

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadString_Binary(COBImporter *this,string *out,StreamReaderLE *reader)

{
  size_type sVar1;
  pointer pcVar2;
  short sVar3;
  char cVar4;
  size_type sVar5;
  
  sVar3 = StreamReader<false,_false>::Get<short>(reader);
  std::__cxx11::string::resize((ulong)out,(char)sVar3);
  sVar1 = out->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (out->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      cVar4 = StreamReader<false,_false>::Get<signed_char>(reader);
      pcVar2[sVar5] = cVar4;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return;
}

Assistant:

void COBImporter::ReadString_Binary(std::string& out, StreamReaderLE& reader)
{
    out.resize( reader.GetI2());
    for(char& c : out) {
        c = reader.GetI1();
    }
}